

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::EndSection(XmlReporter *this,string *param_2,Counts *assertions)

{
  ScopedElement *this_00;
  ScopedElement *in_RDI;
  unsigned_long *in_stack_ffffffffffffff30;
  allocator *paVar1;
  XmlWriter *in_stack_ffffffffffffff58;
  XmlWriter *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  paVar1 = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"OverallResults",paVar1);
  XmlWriter::scopedElement(in_stack_ffffffffffffff58,(string *)paVar1);
  paVar1 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"successes",paVar1);
  this_00 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                      (in_RDI,(string *)paVar1,in_stack_ffffffffffffff30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff60,"failures",(allocator *)&stack0xffffffffffffff5f);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (in_RDI,(string *)paVar1,(unsigned_long *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  XmlWriter::ScopedElement::~ScopedElement(this_00);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  XmlWriter::endElement(in_stack_ffffffffffffff60);
  return;
}

Assistant:

virtual void EndSection( const std::string& /*sectionName*/, const Counts& assertions ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", assertions.passed )
                .writeAttribute( "failures", assertions.failed );
            m_xml.endElement();
        }